

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlacon2.c
# Opt level: O0

int zlacon2_(int *n,doublecomplex *v,doublecomplex *x,double *est,int *kase,int *isave)

{
  integer *piVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double safmin;
  double temp;
  int i;
  double estold;
  double altsgn;
  int jlast;
  double d__1;
  doublecomplex one;
  doublecomplex zero;
  int c__1;
  int *isave_local;
  int *kase_local;
  double *est_local;
  doublecomplex *x_local;
  doublecomplex *v_local;
  int *n_local;
  
  zero.i._4_4_ = 1;
  memset(&one.i,0,0x10);
  one.r = 0.0;
  dVar4 = dmach("Safe minimum");
  if (*kase == 0) {
    for (temp._4_4_ = 0; temp._4_4_ < *n; temp._4_4_ = temp._4_4_ + 1) {
      x[temp._4_4_].r = 1.0 / (double)*n;
      x[temp._4_4_].i = 0.0;
    }
    *kase = 1;
    *isave = 1;
    return 0;
  }
  switch(*isave) {
  case 1:
  default:
    if (*n == 1) {
      v->r = x->r;
      v->i = x->i;
      dVar4 = z_abs(v);
      *est = dVar4;
LAB_0012bc84:
      *kase = 0;
    }
    else {
      dVar5 = dzsum1_slu(n,x,(int *)((long)&zero.i + 4));
      *est = dVar5;
      for (temp._4_4_ = 0; temp._4_4_ < *n; temp._4_4_ = temp._4_4_ + 1) {
        dVar5 = z_abs(x + temp._4_4_);
        if (dVar5 <= dVar4) {
          x[temp._4_4_].r = 1.0;
          x[temp._4_4_].i = one.r;
        }
        else {
          x[temp._4_4_].r = (1.0 / dVar5) * x[temp._4_4_].r;
          x[temp._4_4_].i = (1.0 / dVar5) * x[temp._4_4_].i;
        }
      }
      *kase = 2;
      *isave = 2;
    }
    break;
  case 2:
    iVar2 = izmax1_slu(n,x,(int *)((long)&zero.i + 4));
    isave[1] = iVar2;
    isave[1] = isave[1] + -1;
    isave[2] = 2;
    goto LAB_0012b8b5;
  case 3:
    piVar1 = (integer *)((long)&zero.i + 4);
    zcopy_(n,x,piVar1,v,piVar1);
    dVar5 = *est;
    dVar6 = dzsum1_slu(n,v,(int *)((long)&zero.i + 4));
    *est = dVar6;
    if (dVar5 < *est) {
      for (temp._4_4_ = 0; temp._4_4_ < *n; temp._4_4_ = temp._4_4_ + 1) {
        dVar5 = z_abs(x + temp._4_4_);
        if (dVar5 <= dVar4) {
          x[temp._4_4_].r = 1.0;
          x[temp._4_4_].i = one.r;
        }
        else {
          x[temp._4_4_].r = (1.0 / dVar5) * x[temp._4_4_].r;
          x[temp._4_4_].i = (1.0 / dVar5) * x[temp._4_4_].i;
        }
      }
      *kase = 2;
      *isave = 4;
      return 0;
    }
LAB_0012bb29:
    estold = 1.0;
    for (temp._4_4_ = 1; temp._4_4_ <= *n; temp._4_4_ = temp._4_4_ + 1) {
      x[temp._4_4_ + -1].r = estold * ((double)(temp._4_4_ + -1) / (double)(*n + -1) + 1.0);
      x[temp._4_4_ + -1].i = 0.0;
      estold = -estold;
    }
    *kase = 1;
    *isave = 5;
    return 0;
  case 4:
    iVar2 = isave[1];
    iVar3 = izmax1_slu(n,x,(int *)((long)&zero.i + 4));
    isave[1] = iVar3;
    isave[1] = isave[1] + -1;
    if (((x[iVar2].r == ABS(x[isave[1]].r)) && (!NAN(x[iVar2].r) && !NAN(ABS(x[isave[1]].r)))) ||
       (4 < isave[2])) goto LAB_0012bb29;
    isave[2] = isave[2] + 1;
LAB_0012b8b5:
    for (temp._4_4_ = 0; temp._4_4_ < *n; temp._4_4_ = temp._4_4_ + 1) {
      x[temp._4_4_].r = one.i;
      x[temp._4_4_].i = zero.r;
    }
    iVar2 = isave[1];
    x[iVar2].r = 1.0;
    x[iVar2].i = one.r;
    *kase = 1;
    *isave = 3;
    break;
  case 5:
    dVar4 = dzsum1_slu(n,x,(int *)((long)&zero.i + 4));
    dVar4 = (dVar4 / (double)(*n * 3)) * 2.0;
    if (*est <= dVar4 && dVar4 != *est) {
      piVar1 = (integer *)((long)&zero.i + 4);
      zcopy_(n,x,piVar1,v,piVar1);
      *est = dVar4;
    }
    goto LAB_0012bc84;
  }
  return 0;
}

Assistant:

int
zlacon2_(int *n, doublecomplex *v, doublecomplex *x, double *est, int *kase, int isave[3])
{
    /* Table of constant values */
    int c__1 = 1;
    doublecomplex      zero = {0.0, 0.0};
    doublecomplex      one = {1.0, 0.0};

    /* System generated locals */
    double d__1;
    
    /* Local variables */
    int jlast;
    double altsgn, estold;
    int i;
    double temp;
    double safmin;
    extern double dmach(char *);
    extern int izmax1_slu(int *, doublecomplex *, int *);
    extern double dzsum1_slu(int *, doublecomplex *, int *);
    extern void zcopy_(int *, doublecomplex *, int *, doublecomplex *, int *);

    safmin = dmach("Safe minimum");
    if ( *kase == 0 ) {
	for (i = 0; i < *n; ++i) {
	    x[i].r = 1. / (double) (*n);
	    x[i].i = 0.;
	}
	*kase = 1;
	isave[0] = 1;	/* jump = 1; */
	return 0;
    }

    switch (isave[0]) {
	case 1:  goto L20;
	case 2:  goto L40;
	case 3:  goto L70;
	case 4:  goto L110;
	case 5:  goto L140;
    }

    /*     ................ ENTRY   (isave[0] == 1)   
	   FIRST ITERATION.  X HAS BEEN OVERWRITTEN BY A*X. */
  L20:
    if (*n == 1) {
	v[0] = x[0];
	*est = z_abs(&v[0]);
	/*        ... QUIT */
	goto L150;
    }
    *est = dzsum1_slu(n, x, &c__1);

    for (i = 0; i < *n; ++i) {
	d__1 = z_abs(&x[i]);
	if (d__1 > safmin) {
	    d__1 = 1 / d__1;
	    x[i].r *= d__1;
	    x[i].i *= d__1;
	} else {
	    x[i] = one;
	}
    }
    *kase = 2;
    isave[0] = 2;  /* jump = 2; */
    return 0;

    /*     ................ ENTRY   (isave[0] == 2)   
	   FIRST ITERATION.  X HAS BEEN OVERWRITTEN BY TRANSPOSE(A)*X. */
L40:
    isave[1] = izmax1_slu(n, &x[0], &c__1);  /* j */
    --isave[1];  /* --j; */
    isave[2] = 2; /* iter = 2; */

    /*     MAIN LOOP - ITERATIONS 2,3,...,ITMAX. */
L50:
    for (i = 0; i < *n; ++i) x[i] = zero;
    x[isave[1]] = one;
    *kase = 1;
    isave[0] = 3;  /* jump = 3; */
    return 0;

    /*     ................ ENTRY   (isave[0] == 3)   
	   X HAS BEEN OVERWRITTEN BY A*X. */
L70:
#ifdef _CRAY
    CCOPY(n, x, &c__1, v, &c__1);
#else
    zcopy_(n, x, &c__1, v, &c__1);
#endif
    estold = *est;
    *est = dzsum1_slu(n, v, &c__1);


L90:
    /*     TEST FOR CYCLING. */
    if (*est <= estold) goto L120;

    for (i = 0; i < *n; ++i) {
	d__1 = z_abs(&x[i]);
	if (d__1 > safmin) {
	    d__1 = 1 / d__1;
	    x[i].r *= d__1;
	    x[i].i *= d__1;
	} else {
	    x[i] = one;
	}
    }
    *kase = 2;
    isave[0] = 4;  /* jump = 4; */
    return 0;

    /*     ................ ENTRY   (isave[0] == 4)
	   X HAS BEEN OVERWRITTEN BY TRANSPOSE(A)*X. */
L110:
    jlast = isave[1];  /* j; */
    isave[1] = izmax1_slu(n, &x[0], &c__1); /* j */
    isave[1] = isave[1] - 1;  /* --j; */
    if (x[jlast].r != (d__1 = x[isave[1]].r, fabs(d__1)) && isave[2] < 5) {
	isave[2] = isave[2] + 1;  /* ++iter; */
	goto L50;
    }

    /*     ITERATION COMPLETE.  FINAL STAGE. */
L120:
    altsgn = 1.;
    for (i = 1; i <= *n; ++i) {
	x[i-1].r = altsgn * ((double)(i - 1) / (double)(*n - 1) + 1.);
	x[i-1].i = 0.;
	altsgn = -altsgn;
    }
    *kase = 1;
    isave[0] = 5;  /* jump = 5; */
    return 0;
    
    /*     ................ ENTRY   (isave[0] = 5)   
	   X HAS BEEN OVERWRITTEN BY A*X. */
L140:
    temp = dzsum1_slu(n, x, &c__1) / (double)(*n * 3) * 2.;
    if (temp > *est) {
#ifdef _CRAY
	CCOPY(n, &x[0], &c__1, &v[0], &c__1);
#else
	zcopy_(n, &x[0], &c__1, &v[0], &c__1);
#endif
	*est = temp;
    }

L150:
    *kase = 0;
    return 0;

}